

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O3

void UnityPrintFloat(UNITY_DOUBLE input_number)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  char *string;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  char buf [16];
  undefined8 uStack_40;
  byte local_38 [16];
  UNITY_DOUBLE local_28;
  
  if ((input_number < 0.0) ||
     (((input_number == 0.0 && (!NAN(input_number))) && (1.0 / input_number < 0.0)))) {
    uStack_40 = 0x101c5d;
    local_28 = input_number;
    putchar(0x2d);
    input_number = -local_28;
  }
  if ((input_number == 0.0) && (!NAN(input_number))) {
    string = "0";
LAB_00101c9c:
    UnityPrint(string);
    return;
  }
  if (NAN(input_number)) {
    string = "nan";
    goto LAB_00101c9c;
  }
  if (ABS(input_number) == INFINITY) {
    string = "inf";
    goto LAB_00101c9c;
  }
  local_38[0] = 0;
  local_38[1] = 0;
  local_38[2] = 0;
  local_38[3] = 0;
  local_38[4] = 0;
  local_38[5] = 0;
  local_38[6] = 0;
  local_38[7] = 0;
  local_38[8] = 0;
  local_38[9] = 0;
  local_38[10] = 0;
  local_38[0xb] = 0;
  local_38[0xc] = 0;
  local_38[0xd] = 0;
  local_38[0xe] = 0;
  local_38[0xf] = 0;
  iVar3 = 0;
  if (input_number < 0.1) {
    iVar3 = 0;
    do {
      input_number = input_number * 1e+06;
      iVar3 = iVar3 + -6;
    } while (input_number < 0.1);
  }
  for (; input_number < 100000.0; input_number = input_number * 10.0) {
    iVar3 = iVar3 + -1;
  }
  for (; 1e+12 < input_number; input_number = input_number / 1e+06) {
    iVar3 = iVar3 + 6;
  }
  for (; 1e+06 < input_number; input_number = input_number / 10.0) {
    iVar3 = iVar3 + 1;
  }
  iVar1 = (int)(input_number + input_number);
  iVar2 = 100000;
  if (iVar1 < 1999999) {
    iVar2 = (iVar1 - (iVar1 + 1 >> 0x1f)) + 1 >> 1;
  }
  iVar5 = iVar3 + (uint)(0x1e847e < iVar1);
  uVar4 = 5;
  if (iVar3 + (uint)(0x1e847e < iVar1) + 9 < 10) {
    uVar4 = -iVar5;
  }
  uVar6 = iVar5 + uVar4;
  if (((int)uVar4 < 1) || (uVar9 = uVar4, iVar2 % 10 != 0)) {
    if ((iVar2 == 0) && ((int)uVar4 < 0)) goto LAB_00101e81;
  }
  else {
    do {
      iVar2 = iVar2 / 10;
      uVar4 = uVar9 - 1;
      if (uVar9 < 2) break;
      uVar9 = uVar4;
    } while (iVar2 % 10 == 0);
  }
  lVar11 = 0;
  uVar9 = 1;
  do {
    do {
      uVar8 = uVar9;
      lVar7 = lVar11;
      iVar3 = iVar2 / 10;
      lVar11 = lVar7 + 1;
      local_38[lVar7] = (char)iVar2 + (char)iVar3 * -10 + 0x30;
      uVar10 = iVar2 - 10;
      uVar9 = uVar8 + 1;
      iVar2 = iVar3;
    } while (uVar10 < 0xffffffed);
  } while (lVar7 < (int)uVar4);
  if (0 < (int)lVar11) {
    lVar11 = (ulong)(uVar8 & 0x7fffffff) + 1;
    do {
      if (lVar11 - (ulong)uVar4 == 1) {
        uStack_40 = 0x101e6d;
        putchar(0x2e);
      }
      uStack_40 = 0x101e78;
      putchar((int)*(char *)((long)&uStack_40 + lVar11 + 6));
      lVar11 = lVar11 + -1;
    } while (1 < lVar11);
  }
LAB_00101e81:
  if (uVar6 != 0) {
    uStack_40 = 0x101e8f;
    putchar(0x65);
    if ((int)uVar6 < 0) {
      uStack_40 = 0x101ea9;
      putchar(0x2d);
      uVar6 = -uVar6;
    }
    else {
      uStack_40 = 0x101e9d;
      putchar(0x2b);
    }
    uVar12 = 0xffffffffffffffff;
    do {
      local_38[uVar12 + 1] = (char)uVar6 + (char)(uVar6 / 10) * -10 | 0x30;
      bVar13 = 9 < uVar6;
      uVar12 = uVar12 + 1;
      uVar6 = uVar6 / 10;
    } while (uVar12 == 0 || bVar13);
    do {
      uStack_40 = 0x101ef4;
      putchar((int)(char)local_38[uVar12 & 0xffffffff]);
      uVar12 = uVar12 - 1;
    } while (1 < (int)uVar12 + 2);
  }
  return;
}

Assistant:

void UnityPrintFloat(const UNITY_DOUBLE input_number)
{
    UNITY_DOUBLE number = input_number;

    /* print minus sign (including for negative zero) */
    if (number < 0.0f || (number == 0.0f && 1.0f / number < 0.0f))
    {
        UNITY_OUTPUT_CHAR('-');
        number = -number;
    }

    /* handle zero, NaN, and +/- infinity */
    if (number == 0.0f)
    {
        UnityPrint("0");
    }
    else if (isnan(number))
    {
        UnityPrint("nan");
    }
    else if (isinf(number))
    {
        UnityPrint("inf");
    }
    else
    {
        int exponent = 0;
        int decimals, digits;
        UNITY_INT32 n;
        char buf[16] = {0};

        /* scale up or down by powers of 10 */
        while (number < 100000.0f / 1e6f)  { number *= 1e6f; exponent -= 6; }
        while (number < 100000.0f)         { number *= 10.0f; exponent--; }
        while (number > 1000000.0f * 1e6f) { number /= 1e6f; exponent += 6; }
        while (number > 1000000.0f)        { number /= 10.0f; exponent++; }

        /* round to nearest integer */
        n = ((UNITY_INT32)(number + number) + 1) / 2;
        if (n > 999999)
        {
            n = 100000;
            exponent++;
        }

        /* determine where to place decimal point */
        decimals = (exponent <= 0 && exponent >= -9) ? -exponent : 5;
        exponent += decimals;

        /* truncate trailing zeroes after decimal point */
        while (decimals > 0 && n % 10 == 0)
        {
            n /= 10;
            decimals--;
        }

        /* build up buffer in reverse order */
        digits = 0;
        while (n != 0 || digits < decimals + 1)
        {
            buf[digits++] = (char)('0' + n % 10);
            n /= 10;
        }
        while (digits > 0)
        {
            if(digits == decimals) UNITY_OUTPUT_CHAR('.');
            UNITY_OUTPUT_CHAR(buf[--digits]);
        }

        /* print exponent if needed */
        if (exponent != 0)
        {
            UNITY_OUTPUT_CHAR('e');

            if(exponent < 0)
            {
                UNITY_OUTPUT_CHAR('-');
                exponent = -exponent;
            }
            else
            {
                UNITY_OUTPUT_CHAR('+');
            }

            digits = 0;
            while (exponent != 0 || digits < 2)
            {
                buf[digits++] = (char)('0' + exponent % 10);
                exponent /= 10;
            }
            while (digits > 0)
            {
                UNITY_OUTPUT_CHAR(buf[--digits]);
            }
        }
    }
}